

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void fmt::v11::detail::value<fmt::v11::context>::
     format_custom<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,fmt::v11::formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,char,void>>
               (void *arg,parse_context<char> *parse_ctx,context *ctx)

{
  iterator iVar1;
  context *in_RDX;
  formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_char,_void>
  *in_RSI;
  context *in_RDI;
  view *unaff_retaddr;
  formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_char,_void>
  *in_stack_00000008;
  formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_char,_void>
  *cf;
  formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_char,_void>
  f;
  parse_context<char> *in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc8;
  parse_context<char> *in_stack_ffffffffffffffd0;
  undefined1 local_19;
  context *local_18;
  formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_char,_void>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(&local_19,0,1);
  formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_char,_void>
  ::parse(local_10,in_stack_ffffffffffffffb8);
  parse_context<char>::advance_to(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  iVar1 = formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_char,_void>
          ::format<fmt::v11::context>(in_stack_00000008,unaff_retaddr,in_RDI);
  v11::context::advance_to(local_18,iVar1);
  return;
}

Assistant:

static void format_custom(void* arg, parse_context<char_type>& parse_ctx,
                            Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_formatter<const T, char_type>(), const T, T>;
    // format must be const for compatibility with std::format and compilation.
    const auto& cf = f;
    ctx.advance_to(cf.format(*static_cast<qualified_type*>(arg), ctx));
  }